

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_s.cpp
# Opt level: O1

void sswap(int n,float *x,int incx,float *y,int incy)

{
  float fVar1;
  ulong uVar2;
  float *pfVar3;
  uint uVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  
  if (0 < n) {
    if (incy != 1 || incx != 1) {
      pfVar5 = x + (incx >> 0x1f & (1 - n) * incx);
      pfVar3 = y + (incy >> 0x1f & (1 - n) * incy);
      do {
        fVar1 = *pfVar5;
        *pfVar5 = *pfVar3;
        *pfVar3 = fVar1;
        pfVar5 = pfVar5 + incx;
        pfVar3 = pfVar3 + incy;
        n = n + -1;
      } while (n != 0);
      return;
    }
    uVar2 = (ulong)(uint)n;
    uVar4 = (uint)n % 3;
    if (uVar4 != 0) {
      uVar7 = 0;
      do {
        fVar1 = x[uVar7];
        x[uVar7] = y[uVar7];
        y[uVar7] = fVar1;
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    if ((int)uVar4 < n) {
      uVar7 = uVar2 / 3;
      lVar6 = 0;
      do {
        fVar1 = x[uVar7 * -3 + uVar2 + lVar6];
        x[uVar7 * -3 + uVar2 + lVar6] = y[uVar7 * -3 + uVar2 + lVar6];
        y[uVar7 * -3 + uVar2 + lVar6] = fVar1;
        fVar1 = x[uVar7 * -3 + uVar2 + lVar6 + 1];
        x[uVar7 * -3 + uVar2 + lVar6 + 1] = y[uVar7 * -3 + uVar2 + lVar6 + 1];
        y[uVar7 * -3 + uVar2 + lVar6 + 1] = fVar1;
        fVar1 = x[uVar7 * -3 + uVar2 + lVar6 + 2];
        x[uVar7 * -3 + uVar2 + lVar6 + 2] = y[uVar7 * -3 + uVar2 + lVar6 + 2];
        y[uVar7 * -3 + uVar2 + lVar6 + 2] = fVar1;
        lVar6 = lVar6 + 3;
      } while (n + (int)uVar7 * -3 + (int)lVar6 < n);
    }
  }
  return;
}

Assistant:

void sswap ( int n, float x[], int incx, float y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    SSWAP interchanges two float vectors.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    23 February 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, float X[*], one of the vectors to swap.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Input/output, float Y[*], one of the vectors to swap.
//
//    Input, int INCY, the increment between successive elements of Y.
//
{
  int i;
  int ix;
  int iy;
  int m;
  float temp;

  if ( n <= 0 )
  {
  }
  else if ( incx == 1 && incy == 1 )
  {
    m = n % 3;

    for ( i = 0; i < m; i++ )
    {
      temp = x[i];
      x[i] = y[i];
      y[i] = temp;
    }

    for ( i = m; i < n; i = i + 3 )
    {
      temp = x[i];
      x[i] = y[i];
      y[i] = temp;

      temp = x[i+1];
      x[i+1] = y[i+1];
      y[i+1] = temp;

      temp = x[i+2];
      x[i+2] = y[i+2];
      y[i+2] = temp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( - n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( - n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      temp = x[ix];
      x[ix] = y[iy];
      y[iy] = temp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  return;
}